

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

VRCORETYPE_ID __thiscall
MinVR::VRDataIndex::getType(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  VRCORETYPE_ID VVar1;
  VRDatum *this_00;
  byte in_CL;
  VRDatumPtr *in_RDX;
  bool in_stack_000000e7;
  string *in_stack_000000e8;
  string *in_stack_000000f0;
  VRDataIndex *in_stack_000000f8;
  string local_50 [32];
  VRDatumPtr local_30;
  byte local_19;
  
  local_19 = in_CL & 1;
  std::__cxx11::string::string(local_50,(string *)in_RDX);
  _getDatum(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e7);
  this_00 = VRDatumPtr::operator->(&local_30);
  VVar1 = VRDatum::getType(this_00);
  VRDatumPtr::~VRDatumPtr(in_RDX);
  std::__cxx11::string::~string(local_50);
  return VVar1;
}

Assistant:

VRCORETYPE_ID getType(const std::string &key,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    return _getDatum(key, nameSpace, inherit)->getType();
  }